

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.cpp
# Opt level: O0

int duckdb::History::Load(char *filename)

{
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  char *pcVar4;
  ulong uVar5;
  char *in_RDI;
  char *buf;
  string result;
  LineReader reader;
  char *in_stack_fffffffffff69f38;
  LineReader *in_stack_fffffffffff69f40;
  undefined7 in_stack_fffffffffff69f60;
  LineReader *in_stack_fffffffffff69f68;
  char *in_stack_fffffffffff69f78;
  undefined1 auStack_96060 [614492];
  int local_4;
  
  LineReader::LineReader((LineReader *)(auStack_96060 + 0x20));
  bVar1 = LineReader::Init(in_stack_fffffffffff69f40,in_stack_fffffffffff69f38);
  if (bVar1) {
    ::std::__cxx11::string::string((string *)auStack_96060);
    while (uVar2 = LineReader::NextLine(in_stack_fffffffffff69f68), (bool)uVar2) {
      pcVar4 = LineReader::GetLine((LineReader *)(auStack_96060 + 0x20));
      uVar5 = ::std::__cxx11::string::empty();
      if (((uVar5 & 1) == 0) || (*pcVar4 != '.')) {
        ::std::__cxx11::string::operator+=((string *)auStack_96060,pcVar4);
        ::std::__cxx11::string::c_str();
        iVar3 = duckdb_shell_sqlite3_complete(in_stack_fffffffffff69f78);
        if (iVar3 == 0) {
          ::std::__cxx11::string::operator+=((string *)auStack_96060,"\r\n");
        }
        else {
          in_stack_fffffffffff69f40 = (LineReader *)auStack_96060;
          ::std::__cxx11::string::c_str();
          ::std::__cxx11::string::size();
          Add((char *)in_stack_fffffffffff69f68,CONCAT17(uVar2,in_stack_fffffffffff69f60));
          ::std::__cxx11::string::string((string *)&stack0xfffffffffff69f68);
          ::std::__cxx11::string::operator=
                    ((string *)auStack_96060,(string *)&stack0xfffffffffff69f68);
          ::std::__cxx11::string::~string((string *)&stack0xfffffffffff69f68);
        }
      }
      else {
        Add((char *)in_stack_fffffffffff69f40);
      }
    }
    LineReader::Close(in_stack_fffffffffff69f40);
    history_file = strdup(in_RDI);
    local_4 = 0;
    ::std::__cxx11::string::~string((string *)auStack_96060);
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int History::Load(const char *filename) {
	LineReader reader;
	if (!reader.Init(filename)) {
		return -1;
	}

	std::string result;
	while (reader.NextLine()) {
		auto buf = reader.GetLine();
		if (result.empty() && buf[0] == '.') {
			// if the first character is a dot this is a dot command
			// add the full line to the history
			History::Add(buf);
			continue;
		}
		// else we are parsing a SQL statement
		result += buf;
		if (sqlite3_complete(result.c_str())) {
			// this line contains a full SQL statement - add it to the history
			History::Add(result.c_str(), result.size());
			result = std::string();
			continue;
		}
		// the result does not contain a full SQL statement - add a newline deliminator and move on to the next line
		result += "\r\n";
	}
	reader.Close();

	history_file = strdup(filename);
	return 0;
}